

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XSerializerTest.cpp
# Opt level: O0

int main(int argC,char **argV)

{
  byte bVar1;
  int iVar2;
  char *__s1;
  size_t sVar3;
  ostream *poVar4;
  char local_648 [8];
  char fURI [1000];
  char local_250 [8];
  ifstream fin;
  XMLException *toCatch;
  char *parm;
  int argInd;
  char **argV_local;
  int argC_local;
  
  if (argC < 2) {
    usage();
    argV_local._4_4_ = 1;
  }
  else {
    memset(localeStr,0,0x40);
    parm._4_4_ = 1;
    while ((parm._4_4_ < argC && (*argV[parm._4_4_] == '-'))) {
      iVar2 = strcmp(argV[parm._4_4_],"-?");
      if (iVar2 == 0) {
        usage();
        return 2;
      }
      iVar2 = strncmp(argV[parm._4_4_],"-v=",3);
      if ((iVar2 == 0) || (iVar2 = strncmp(argV[parm._4_4_],"-V=",3), iVar2 == 0)) {
        __s1 = argV[parm._4_4_] + 3;
        iVar2 = strcmp(__s1,"never");
        if (iVar2 == 0) {
          valScheme = Val_Never;
        }
        else {
          iVar2 = strcmp(__s1,"auto");
          if (iVar2 == 0) {
            valScheme = Val_Auto;
          }
          else {
            iVar2 = strcmp(__s1,"always");
            if (iVar2 != 0) {
              poVar4 = std::operator<<((ostream *)&std::cerr,"Unknown -v= value: ");
              poVar4 = std::operator<<(poVar4,__s1);
              std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
              return 2;
            }
            valScheme = Val_Always;
          }
        }
      }
      else {
        iVar2 = strcmp(argV[parm._4_4_],"-n");
        if ((iVar2 == 0) || (iVar2 = strcmp(argV[parm._4_4_],"-N"), iVar2 == 0)) {
          doNamespaces = false;
        }
        else {
          iVar2 = strcmp(argV[parm._4_4_],"-s");
          if ((iVar2 == 0) || (iVar2 = strcmp(argV[parm._4_4_],"-S"), iVar2 == 0)) {
            doSchema = false;
          }
          else {
            iVar2 = strcmp(argV[parm._4_4_],"-f");
            if ((iVar2 == 0) || (iVar2 = strcmp(argV[parm._4_4_],"-F"), iVar2 == 0)) {
              schemaFullChecking = true;
            }
            else {
              iVar2 = strcmp(argV[parm._4_4_],"-l");
              if ((iVar2 == 0) || (iVar2 = strcmp(argV[parm._4_4_],"-L"), iVar2 == 0)) {
                doList = true;
              }
              else {
                iVar2 = strcmp(argV[parm._4_4_],"-p");
                if ((iVar2 == 0) || (iVar2 = strcmp(argV[parm._4_4_],"-P"), iVar2 == 0)) {
                  namespacePrefixes = true;
                }
                else {
                  iVar2 = strcmp(argV[parm._4_4_],"-special:nel");
                  if (iVar2 == 0) {
                    recognizeNEL = true;
                  }
                  else {
                    iVar2 = strncmp(argV[parm._4_4_],"-locale=",8);
                    if (iVar2 == 0) {
                      strcpy(localeStr,argV[parm._4_4_] + 8);
                    }
                    else {
                      poVar4 = std::operator<<((ostream *)&std::cerr,"Unknown option \'");
                      poVar4 = std::operator<<(poVar4,argV[parm._4_4_]);
                      poVar4 = std::operator<<(poVar4,"\', ignoring it\n");
                      std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
                    }
                  }
                }
              }
            }
          }
        }
      }
      parm._4_4_ = parm._4_4_ + 1;
    }
    if (parm._4_4_ == argC) {
      usage();
      argV_local._4_4_ = 1;
    }
    else {
      sVar3 = strlen(localeStr);
      if (sVar3 == 0) {
        xercesc_4_0::XMLPlatformUtils::Initialize
                  ((char *)&xercesc_4_0::XMLUni::fgXercescDefaultLocale,(char *)0x0,
                   (PanicHandler *)0x0,(MemoryManager *)0x0);
      }
      else {
        xercesc_4_0::XMLPlatformUtils::Initialize
                  (localeStr,(char *)0x0,(PanicHandler *)0x0,(MemoryManager *)0x0);
      }
      if ((recognizeNEL & 1U) != 0) {
        xercesc_4_0::XMLPlatformUtils::recognizeNEL
                  ((bool)(recognizeNEL & 1),xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
      }
      std::ifstream::ifstream(local_250);
      if ((doList & 1U) != 0) {
        std::ifstream::open(local_250,argV[parm._4_4_],8);
      }
      bVar1 = std::ios::fail();
      if ((bVar1 & 1) == 0) {
LAB_001091f5:
        memset(local_648,0,1000);
        if ((doList & 1U) == 0) {
          if (parm._4_4_ < argC) {
            xmlFile = argV[parm._4_4_];
            parm._4_4_ = parm._4_4_ + 1;
            goto LAB_001092f9;
          }
        }
        else {
          bVar1 = std::ios::eof();
          if ((bVar1 & 1) == 0) goto LAB_00109247;
        }
        if ((doList & 1U) != 0) {
          std::ifstream::close();
        }
        xercesc_4_0::XMLPlatformUtils::Terminate();
        if ((errorOccurred & 1U) == 0) {
          argV_local._4_4_ = 0;
        }
        else {
          argV_local._4_4_ = 4;
        }
      }
      else {
        poVar4 = std::operator<<((ostream *)&std::cerr,"Cannot open the list file: ");
        poVar4 = std::operator<<(poVar4,argV[parm._4_4_]);
        std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
        argV_local._4_4_ = 2;
      }
      std::ifstream::~ifstream(local_250);
    }
  }
  return argV_local._4_4_;
LAB_00109247:
  std::istream::getline(local_250,(long)local_648);
  if (local_648[0] != '\0') {
    xmlFile = local_648;
    poVar4 = std::operator<<((ostream *)&std::cerr,"==Parsing== ");
    poVar4 = std::operator<<(poVar4,xmlFile);
    std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
LAB_001092f9:
    parseCase(xmlFile);
  }
  goto LAB_001091f5;
}

Assistant:

int main(int argC, char* argV[])
{

    // Check command line and extract arguments.
    if (argC < 2)
    {
        usage();
        return 1;
    }

    memset(localeStr, 0, sizeof localeStr);

    int argInd;
    for (argInd = 1; argInd < argC; argInd++)
    {
        // Break out on first parm not starting with a dash
        if (argV[argInd][0] != '-')
            break;

        // Watch for special case help request
        if (!strcmp(argV[argInd], "-?"))
        {
            usage();
            return 2;
        }
         else if (!strncmp(argV[argInd], "-v=", 3)
              ||  !strncmp(argV[argInd], "-V=", 3))
        {
            const char* const parm = &argV[argInd][3];

            if (!strcmp(parm, "never"))
                valScheme = SAX2XMLReader::Val_Never;
            else if (!strcmp(parm, "auto"))
                valScheme = SAX2XMLReader::Val_Auto;
            else if (!strcmp(parm, "always"))
                valScheme = SAX2XMLReader::Val_Always;
            else
            {
                std::cerr << "Unknown -v= value: " << parm << std::endl;
                return 2;
            }
        }
         else if (!strcmp(argV[argInd], "-n")
              ||  !strcmp(argV[argInd], "-N"))
        {
            doNamespaces = false;
        }
         else if (!strcmp(argV[argInd], "-s")
              ||  !strcmp(argV[argInd], "-S"))
        {
            doSchema = false;
        }
         else if (!strcmp(argV[argInd], "-f")
              ||  !strcmp(argV[argInd], "-F"))
        {
            schemaFullChecking = true;
        }
         else if (!strcmp(argV[argInd], "-l")
              ||  !strcmp(argV[argInd], "-L"))
        {
            doList = true;
        }
         else if (!strcmp(argV[argInd], "-p")
              ||  !strcmp(argV[argInd], "-P"))
        {
            namespacePrefixes = true;
        }
         else if (!strcmp(argV[argInd], "-special:nel"))
        {
            // turning this on will lead to non-standard compliance behaviour
            // it will recognize the unicode character 0x85 as new line character
            // instead of regular character as specified in XML 1.0
            // do not turn this on unless really necessary
             recognizeNEL = true;
        }
         else if (!strncmp(argV[argInd], "-locale=", 8))
        {
             // Get out the end of line
             strcpy(localeStr, &(argV[argInd][8]));
        }
        else
        {
            std::cerr << "Unknown option '" << argV[argInd]
                << "', ignoring it\n" << std::endl;
        }
    }

    //
    //  There should at least one parameter left, and that
    //  should be the file name(s).
    //
    if (argInd == argC)
    {
        usage();
        return 1;
    }

    // Initialize the XML4C2 system
    try
    {
        if (strlen(localeStr))
        {
            XMLPlatformUtils::Initialize(localeStr);
        }
        else
        {
            XMLPlatformUtils::Initialize();
        }

        if (recognizeNEL)
        {
            XMLPlatformUtils::recognizeNEL(recognizeNEL);
        }

    }

    catch (const XMLException& toCatch)
    {
        std::cerr << "Error during initialization! Message:\n"
            << StrX(toCatch.getMessage()) << std::endl;
        return 1;
    }

    std::ifstream fin;

    // the input is a list file
    if (doList)
        fin.open(argV[argInd]);

    if (fin.fail()) {
        std::cerr <<"Cannot open the list file: " << argV[argInd] << std::endl;
        return 2;
    }

    while (true)
    {
        char fURI[1000];
        //initialize the array to zeros
        memset(fURI,0,sizeof(fURI));

        if (doList) {
            if (! fin.eof() ) {
                fin.getline (fURI, sizeof(fURI));
                if (!*fURI)
                    continue;
                else {
                    xmlFile = fURI;
                    std::cerr << "==Parsing== " << xmlFile << std::endl;
                }
            }
            else
                break;
        }
        else {
            if (argInd < argC)
            {
                 xmlFile = argV[argInd];
                 argInd++;
            }
            else
                break;
        }

        parseCase(xmlFile);
    }

    if (doList)
        fin.close();

    // And call the termination method
    XMLPlatformUtils::Terminate();

    if (errorOccurred)
        return 4;
    else
        return 0;

}